

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emit_test.c
# Opt level: O3

int dbg_emitter(void *emit_context,flatcc_iovec_t *iov,int iov_count,flatbuffers_soffset_t offset,
               size_t len)

{
  uint8_t *puVar1;
  long lVar2;
  
  printf("dbg: emit: iov_count: %d, offset: %ld, len: %ld\n",(ulong)(uint)iov_count,(long)offset,len
        );
  if (0 < iov_count) {
    lVar2 = 0;
    do {
      puVar1 = *(uint8_t **)((long)&iov->iov_base + lVar2);
      if (puVar1 == "") {
        printf("dbg:  padding at: %ld, len: %ld\n",(long)offset,
               *(undefined8 *)((long)&iov->iov_len + lVar2));
        puVar1 = *(uint8_t **)((long)&iov->iov_base + lVar2);
      }
      if (puVar1 == (uint8_t *)0x0) {
        printf("dbg:  null vector reserved at: %ld, len: %ld\n",(long)offset,
               *(undefined8 *)((long)&iov->iov_len + lVar2));
      }
      offset = offset + *(int *)((long)&iov->iov_len + lVar2);
      lVar2 = lVar2 + 0x10;
    } while ((ulong)(uint)iov_count << 4 != lVar2);
  }
  return 0;
}

Assistant:

int dbg_emitter(void *emit_context,
        const flatcc_iovec_t *iov, int iov_count,
        flatbuffers_soffset_t offset, size_t len)
{
    int i;

    (void)emit_context;

    printf("dbg: emit: iov_count: %d, offset: %ld, len: %ld\n",
            (int)iov_count, (long)offset, (long)len);

    for (i = 0; i < iov_count; ++i) {
        if (iov[i].iov_base == flatcc_builder_padding_base) {
            printf("dbg:  padding at: %ld, len: %ld\n",
                    (long)offset, (long)iov[i].iov_len);
        }
        if (iov[i].iov_base == 0) {
            printf("dbg:  null vector reserved at: %ld, len: %ld\n",
                    (long)offset, (long)iov[i].iov_len);
        }
        offset += (flatbuffers_soffset_t)iov[i].iov_len;
    }
    return 0;
}